

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funpack.c
# Opt level: O2

int fu_get_param(int argc,char **argv,fpstate *fpptr)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  
  if (fpptr->initialized != 0x2a) {
    fp_msg("Error: internal initialization error\n");
    goto LAB_0010ba21;
  }
  fpptr->delete_suffix = 1;
  pcVar2 = fpptr->prefix;
  for (iVar3 = 1; iVar3 < argc; iVar3 = iVar3 + 1) {
    __s = argv[iVar3];
    if ((*__s != '-') || (sVar1 = strlen(__s), sVar1 != 2)) break;
    switch(__s[1]) {
    case 'C':
      fpptr->do_checksums = 0;
      break;
    case 'D':
      fpptr->delete_input = fpptr->delete_input + 1;
      break;
    case 'E':
      iVar3 = iVar3 + 1;
      if (argc <= iVar3) goto LAB_0010b9da;
      strncpy(fpptr->extname,argv[iVar3],0x200);
      fpptr->extname[0x200] = '\0';
      break;
    case 'F':
      fpptr->clobber = fpptr->clobber + 1;
      fpptr->delete_suffix = 0;
      break;
    case 'G':
    case 'I':
    case 'J':
    case 'K':
    case 'M':
    case 'N':
    case 'Q':
    case 'R':
    case 'T':
    case 'U':
    case 'W':
    case 'X':
    case 'Y':
switchD_0010b87c_caseD_47:
      fp_msg("Error: unknown command line flag `");
      fp_msg(argv[iVar3]);
      fp_msg("\'\n");
LAB_0010b9da:
      fu_usage();
      fu_hint();
      goto LAB_0010ba21;
    case 'H':
      fu_help();
      goto LAB_0010b9fb;
    case 'L':
      fpptr->listonly = fpptr->listonly + 1;
      break;
    case 'O':
      iVar3 = iVar3 + 1;
      if (argc <= iVar3) goto LAB_0010b9da;
      strncpy(fpptr->outfile,argv[iVar3],0x200);
      fpptr->outfile[0x200] = '\0';
      break;
    case 'P':
      iVar3 = iVar3 + 1;
      if (argc <= iVar3) goto LAB_0010b9da;
      strncpy(pcVar2,argv[iVar3],0x200);
      fpptr->prefix[0x200] = '\0';
      break;
    case 'S':
      fpptr->to_stdout = fpptr->to_stdout + 1;
      break;
    case 'V':
      fp_version();
LAB_0010b9fb:
      exit(0);
    case 'Z':
      fpptr->do_gzip_file = fpptr->do_gzip_file + 1;
      break;
    default:
      if (__s[1] != 'v') goto switchD_0010b87c_caseD_47;
      fpptr->verbose = 1;
    }
  }
  if ((fpptr->extname[0] == '\0') || ((fpptr->clobber == 0 && (fpptr->delete_input == 0)))) {
    if (fpptr->to_stdout == 0) {
      if ((fpptr->outfile[0] == '\0') || (*pcVar2 == '\0')) goto LAB_0010b99c;
      pcVar2 = "Error: -P and -O options may not be used together\n";
    }
    else if ((fpptr->outfile[0] == '\0') && (*pcVar2 == '\0')) {
LAB_0010b99c:
      if (iVar3 < argc) {
        fpptr->firstfile = iVar3;
        return 0;
      }
      pcVar2 = "Error: no FITS files to uncompress\n";
    }
    else {
      pcVar2 = "Error: -S option may not be used with -P or -O\n";
    }
  }
  else {
    pcVar2 = "Error: -E option may not be used with -F or -D\n";
  }
  fp_msg(pcVar2);
  fu_usage();
LAB_0010ba21:
  exit(-1);
}

Assistant:

int fu_get_param (int argc, char *argv[], fpstate *fpptr)
{
	int	iarg;
	char	tile[SZ_STR];

        if (fpptr->initialized != FP_INIT_MAGIC) {
            fp_msg ("Error: internal initialization error\n"); exit (-1);
        }

	tile[0] = 0;

        /* by default, .fz suffix characters to be deleted from compressed file */
	fpptr->delete_suffix = 1;

	/* flags must come first and be separately specified
	 */
	for (iarg = 1; iarg < argc; iarg++) {
	    if (argv[iarg][0] == '-' && strlen (argv[iarg]) == 2) {

		if (argv[iarg][1] == 'F') {
		    fpptr->clobber++;
                    fpptr->delete_suffix = 0;  /* no suffix in this case */

		} else if (argv[iarg][1] == 'D') {
		    fpptr->delete_input++;

		} else if (argv[iarg][1] == 'P') {
		    if (++iarg >= argc) {
			fu_usage (); fu_hint (); exit (-1);
		    } else {
			strncpy (fpptr->prefix, argv[iarg], SZ_STR-1);
                        fpptr->prefix[SZ_STR-1] = 0;
                    }

		} else if (argv[iarg][1] == 'E') {
		    if (++iarg >= argc) {
			fu_usage (); fu_hint (); exit (-1);
		    } else {
			strncpy (fpptr->extname, argv[iarg], SZ_STR-1);
                        fpptr->extname[SZ_STR-1]=0;
                    }

		} else if (argv[iarg][1] == 'S') {
		    fpptr->to_stdout++;

		} else if (argv[iarg][1] == 'L') {
		    fpptr->listonly++;

		} else if (argv[iarg][1] == 'C') {
		    fpptr->do_checksums = 0;

		} else if (argv[iarg][1] == 'H') {
		    fu_help (); exit (0);

		} else if (argv[iarg][1] == 'V') {
		    fp_version (); exit (0);

		} else if (argv[iarg][1] == 'Z') {
		    fpptr->do_gzip_file++;

		} else if (argv[iarg][1] == 'v') {
		    fpptr->verbose = 1;

		} else if (argv[iarg][1] == 'O') {
		    if (++iarg >= argc) {
			fu_usage (); fu_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                    }

		} else {
		    fp_msg ("Error: unknown command line flag `");
		    fp_msg (argv[iarg]); fp_msg ("'\n");
		    fu_usage (); fu_hint (); exit (-1);
		}

	    } else
		break;
	}
	
	if (fpptr->extname[0] && (fpptr->clobber || fpptr->delete_input)) {
	    fp_msg ("Error: -E option may not be used with -F or -D\n");
	    fu_usage (); exit (-1);
        }

	if (fpptr->to_stdout && (fpptr->outfile[0] || fpptr->prefix[0]) ) {

	    fp_msg ("Error: -S option may not be used with -P or -O\n");
	    fu_usage (); exit (-1);
        }

	if (fpptr->outfile[0] && fpptr->prefix[0] ) {
	    fp_msg ("Error: -P and -O options may not be used together\n");
	    fu_usage (); exit (-1);
        }

	if (iarg >= argc) {
	    fp_msg ("Error: no FITS files to uncompress\n");
	    fu_usage (); exit (-1);
	} else
	    fpptr->firstfile = iarg;

	return(0);
}